

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_138c18::SQLiteBuildDB::setCurrentIteration
          (SQLiteBuildDB *this,uint64_t value,string *error_out)

{
  uint uVar1;
  int __oflag;
  string local_a8;
  string local_88;
  string local_68;
  int local_44;
  undefined8 uStack_40;
  int result;
  sqlite3_stmt *stmt;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> guard;
  string *error_out_local;
  uint64_t value_local;
  SQLiteBuildDB *this_local;
  
  guard._M_device = (mutex_type *)error_out;
  std::lock_guard<std::mutex>::lock_guard(&local_30,&this->dbMutex);
  uVar1 = open(this,(char *)guard._M_device,__oflag);
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_44 = sqlite3_prepare_v2(this->db,"UPDATE info SET iteration = ? WHERE id == 0;",0xffffffff
                                  ,&stack0xffffffffffffffc0,0);
    if (local_44 == 0) {
      local_44 = sqlite3_bind_int64(uStack_40,1,value);
      if (local_44 == 0) {
        local_44 = sqlite3_step(uStack_40);
        if (local_44 == 0x65) {
          sqlite3_finalize(uStack_40);
          this_local._7_1_ = true;
        }
        else {
          (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_a8,this);
          std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          sqlite3_finalize(uStack_40);
          this_local._7_1_ = false;
        }
      }
      else {
        (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_88,this);
        std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        this_local._7_1_ = false;
      }
    }
    else {
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_68,this);
      std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      this_local._7_1_ = false;
    }
  }
  stmt._4_4_ = 1;
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return this_local._7_1_;
}

Assistant:

virtual bool setCurrentIteration(uint64_t value, std::string *error_out) override {
    std::lock_guard<std::mutex> guard(dbMutex);

    if (!open(error_out)) {
      return false;
    }

    sqlite3_stmt* stmt;
    int result;
    result = sqlite3_prepare_v2(
      db, "UPDATE info SET iteration = ? WHERE id == 0;",
      -1, &stmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_int64(stmt, /*index=*/1, value);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_step(stmt);
    if (result != SQLITE_DONE) {
      *error_out = getCurrentErrorMessage();
      sqlite3_finalize(stmt);
      return false;
    }

    sqlite3_finalize(stmt);
    return true;
  }